

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

bool duckdb::AllowUnsignedExtensionsSetting::OnGlobalSet
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  InvalidInputException *this;
  bool bVar1;
  allocator local_39;
  string local_38;
  
  if (db != (DatabaseInstance *)0x0) {
    bVar1 = Value::GetValue<bool>(input);
    if (bVar1) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "Cannot change allow_unsigned_extensions setting while database is running",
                 &local_39);
      InvalidInputException::InvalidInputException(this,&local_38);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return true;
}

Assistant:

bool AllowUnsignedExtensionsSetting::OnGlobalSet(DatabaseInstance *db, DBConfig &config, const Value &input) {
	if (db && input.GetValue<bool>()) {
		throw InvalidInputException("Cannot change allow_unsigned_extensions setting while database is running");
	}
	return true;
}